

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_object_literal(JSParseState *s)

{
  int iVar1;
  JSFunctionKindEnum func_kind_00;
  JSParseState *in_RDI;
  int op_flags;
  JSFunctionKindEnum func_kind;
  JSParseFunctionEnum func_type;
  BOOL is_getset;
  BOOL has_proto;
  int prop_type;
  int start_line;
  uint8_t *start_ptr;
  JSAtom name;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  uint8_t in_stack_ffffffffffffffbf;
  undefined3 uVar2;
  uint in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 uVar3;
  int in_stack_ffffffffffffffcc;
  uint8_t val;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  JSAtom func_name;
  JSParseFunctionEnum func_type_00;
  JSParseState *s_00;
  BOOL in_stack_ffffffffffffffe8;
  int allow_method;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  allow_method = 0;
  iVar1 = next_token(_is_getset);
  if (iVar1 == 0) {
    emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
    func_name = 0;
    do {
      if ((in_RDI->token).val == 0x7d) {
LAB_00199df9:
        iVar1 = js_parse_expect((JSParseState *)
                                CONCAT17(in_stack_ffffffffffffffbf,
                                         CONCAT16(in_stack_ffffffffffffffbe,
                                                  CONCAT24(in_stack_ffffffffffffffbc,
                                                           in_stack_ffffffffffffffb8))),0);
        if (iVar1 == 0) {
          return 0;
        }
        break;
      }
      s_00 = (JSParseState *)(in_RDI->token).ptr;
      func_type_00 = (in_RDI->token).line_num;
      if ((in_RDI->token).val == -0x5b) {
        iVar1 = next_token(_is_getset);
        if (iVar1 != 0) {
          return -1;
        }
        iVar1 = js_parse_assign_expr((JSParseState *)0x199ada);
        if (iVar1 != 0) {
          return -1;
        }
        emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
        emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
        emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbf);
        emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
        emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
      }
      else {
        func_kind_00 = js_parse_property_name
                                 ((JSParseState *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  (JSAtom *)in_RDI,allow_method,in_stack_ffffffffffffffe8,
                                  (BOOL)((ulong)s_00 >> 0x20));
        if ((int)func_kind_00 < 0) break;
        if (func_kind_00 == JS_FUNC_GENERATOR) {
          emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                  (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    CONCAT13(in_stack_ffffffffffffffbf,
                             CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
          emit_u16((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   CONCAT11(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffbe));
          emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                  (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
          emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    CONCAT13(in_stack_ffffffffffffffbf,
                             CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
        }
        else if ((in_RDI->token).val == 0x28) {
          uVar2 = (undefined3)in_stack_ffffffffffffffc0;
          in_stack_ffffffffffffffc0 = CONCAT13(1,uVar2);
          if (func_kind_00 != JS_FUNC_ASYNC) {
            in_stack_ffffffffffffffc0 = CONCAT13(func_kind_00 == JS_FUNC_ASYNC_GENERATOR,uVar2);
          }
          in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffc0 >> 0x18;
          uVar3 = 0;
          if (in_stack_ffffffffffffffd0 == 0) {
            in_stack_ffffffffffffffcc = 6;
            if (func_kind_00 == 4) {
              uVar3 = 1;
            }
            else if (func_kind_00 == 5) {
              uVar3 = 2;
            }
            else if (func_kind_00 == 6) {
              uVar3 = 3;
            }
          }
          else {
            in_stack_ffffffffffffffcc = func_kind_00 + JS_FUNC_ASYNC;
          }
          iVar1 = js_parse_function_decl
                            (s_00,func_type_00,func_kind_00,func_name,
                             (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,uVar3),
                             in_stack_ffffffffffffffc4);
          if (iVar1 != 0) break;
          val = (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18);
          if (allow_method == 0) {
            emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),val);
          }
          else {
            emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),val);
            emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      CONCAT13(in_stack_ffffffffffffffbf,
                               CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
          }
          if (in_stack_ffffffffffffffd0 == 0) {
            in_stack_ffffffffffffffc4 = 0;
          }
          else {
            in_stack_ffffffffffffffc4 = func_kind_00 - JS_FUNC_GENERATOR;
          }
          emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbf);
        }
        else {
          iVar1 = js_parse_expect((JSParseState *)
                                  CONCAT17(in_stack_ffffffffffffffbf,
                                           CONCAT16(in_stack_ffffffffffffffbe,
                                                    CONCAT24(in_stack_ffffffffffffffbc,
                                                             in_stack_ffffffffffffffb8))),0);
          if ((iVar1 != 0) || (iVar1 = js_parse_assign_expr((JSParseState *)0x199d12), iVar1 != 0))
          break;
          if (allow_method == 0) {
            set_object_name_computed((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0));
            emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                    (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
            emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                    (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
          }
          else if (allow_method == 0x44) {
            if (func_name != 0) {
              js_parse_error(in_RDI,"duplicate __proto__ property name");
              break;
            }
            emit_op((JSParseState *)(ulong)in_stack_ffffffffffffffd0,
                    (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
            func_name = 1;
          }
          else {
            set_object_name(s_00,func_type_00);
            emit_op((JSParseState *)CONCAT44(func_name,in_stack_ffffffffffffffd0),
                    (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
            emit_atom((JSParseState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      CONCAT13(in_stack_ffffffffffffffbf,
                               CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
          }
        }
        JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    CONCAT13(in_stack_ffffffffffffffbf,
                             CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
      }
      allow_method = 0;
      if ((in_RDI->token).val != 0x2c) goto LAB_00199df9;
      iVar1 = next_token(_is_getset);
    } while (iVar1 == 0);
  }
  JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              CONCAT13(in_stack_ffffffffffffffbf,
                       CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
  return -1;
}

Assistant:

static __exception int js_parse_object_literal(JSParseState *s)
{
    JSAtom name = JS_ATOM_NULL;
    const uint8_t *start_ptr;
    int start_line, prop_type;
    BOOL has_proto;

    if (next_token(s))
        goto fail;
    /* XXX: add an initial length that will be patched back */
    emit_op(s, OP_object);
    has_proto = FALSE;
    while (s->token.val != '}') {
        /* specific case for getter/setter */
        start_ptr = s->token.ptr;
        start_line = s->token.line_num;

        if (s->token.val == TOK_ELLIPSIS) {
            if (next_token(s))
                return -1;
            if (js_parse_assign_expr(s))
                return -1;
            emit_op(s, OP_null);  /* dummy excludeList */
            emit_op(s, OP_copy_data_properties);
            emit_u8(s, 2 | (1 << 2) | (0 << 5));
            emit_op(s, OP_drop); /* pop excludeList */
            emit_op(s, OP_drop); /* pop src object */
            goto next;
        }

        prop_type = js_parse_property_name(s, &name, TRUE, TRUE, FALSE);
        if (prop_type < 0)
            goto fail;

        if (prop_type == PROP_TYPE_VAR) {
            /* shortcut for x: x */
            emit_op(s, OP_scope_get_var);
            emit_atom(s, name);
            emit_u16(s, s->cur_func->scope_level);
            emit_op(s, OP_define_field);
            emit_atom(s, name);
        } else if (s->token.val == '(') {
            BOOL is_getset = (prop_type == PROP_TYPE_GET ||
                              prop_type == PROP_TYPE_SET);
            JSParseFunctionEnum func_type;
            JSFunctionKindEnum func_kind;
            int op_flags;

            func_kind = JS_FUNC_NORMAL;
            if (is_getset) {
                func_type = JS_PARSE_FUNC_GETTER + prop_type - PROP_TYPE_GET;
            } else {
                func_type = JS_PARSE_FUNC_METHOD;
                if (prop_type == PROP_TYPE_STAR)
                    func_kind = JS_FUNC_GENERATOR;
                else if (prop_type == PROP_TYPE_ASYNC)
                    func_kind = JS_FUNC_ASYNC;
                else if (prop_type == PROP_TYPE_ASYNC_STAR)
                    func_kind = JS_FUNC_ASYNC_GENERATOR;
            }
            if (js_parse_function_decl(s, func_type, func_kind, JS_ATOM_NULL,
                                       start_ptr, start_line))
                goto fail;
            if (name == JS_ATOM_NULL) {
                emit_op(s, OP_define_method_computed);
            } else {
                emit_op(s, OP_define_method);
                emit_atom(s, name);
            }
            if (is_getset) {
                op_flags = OP_DEFINE_METHOD_GETTER +
                    prop_type - PROP_TYPE_GET;
            } else {
                op_flags = OP_DEFINE_METHOD_METHOD;
            }
            emit_u8(s, op_flags | OP_DEFINE_METHOD_ENUMERABLE);
        } else {
            if (js_parse_expect(s, ':'))
                goto fail;
            if (js_parse_assign_expr(s))
                goto fail;
            if (name == JS_ATOM_NULL) {
                set_object_name_computed(s);
                emit_op(s, OP_define_array_el);
                emit_op(s, OP_drop);
            } else if (name == JS_ATOM___proto__) {
                if (has_proto) {
                    js_parse_error(s, "duplicate __proto__ property name");
                    goto fail;
                }
                emit_op(s, OP_set_proto);
                has_proto = TRUE;
            } else {
                set_object_name(s, name);
                emit_op(s, OP_define_field);
                emit_atom(s, name);
            }
        }
        JS_FreeAtom(s->ctx, name);
    next:
        name = JS_ATOM_NULL;
        if (s->token.val != ',')
            break;
        if (next_token(s))
            goto fail;
    }
    if (js_parse_expect(s, '}'))
        goto fail;
    return 0;
 fail:
    JS_FreeAtom(s->ctx, name);
    return -1;
}